

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositedBupOutputter.cpp
# Opt level: O0

ssize_t __thiscall
CompositedBupOutputter::write(CompositedBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  string *title;
  path *filename;
  Image *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [8];
  allocator<char> *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  title = (string *)CONCAT44(in_register_00000034,__fd);
  filename = (path *)&local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Image::writePNG(in_stack_ffffffffffffffb0,filename,title);
  std::__cxx11::string::~string(local_38);
  sVar1 = std::allocator<char>::~allocator(&local_39);
  return sVar1;
}

Assistant:

virtual void write(Image& img, fs::path path) {
		img.writePNG(path);
	}